

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O2

void av1_tokenize_color_map
               (MACROBLOCK *x,int plane,TokenExtra **t,BLOCK_SIZE bsize,TX_SIZE tx_size,
               COLOR_MAP_TYPE type,int allow_update_cdf,FRAME_COUNTS *counts)

{
  int allow_update_cdf_00;
  undefined3 in_register_00000089;
  undefined4 uVar1;
  undefined4 in_register_0000008c;
  Av1ColorMapParam AStack_48;
  
  uVar1 = CONCAT31(in_register_00000089,type);
  allow_update_cdf_00 = (int)&AStack_48;
  get_color_map_params
            (x,plane,bsize,type,(COLOR_MAP_TYPE)&AStack_48,
             (Av1ColorMapParam *)CONCAT44(in_register_0000008c,uVar1));
  **t = (TokenExtra)((byte)**t & 0xf8 | *AStack_48.color_map & 7);
  **t = (TokenExtra)((byte)**t | 0xf0);
  *t = *t + 1;
  cost_and_tokenize_map
            (&AStack_48,t,0,allow_update_cdf,allow_update_cdf_00,
             (FRAME_COUNTS *)CONCAT44(in_register_0000008c,uVar1));
  return;
}

Assistant:

void av1_tokenize_color_map(const MACROBLOCK *const x, int plane,
                            TokenExtra **t, BLOCK_SIZE bsize, TX_SIZE tx_size,
                            COLOR_MAP_TYPE type, int allow_update_cdf,
                            FRAME_COUNTS *counts) {
  assert(plane == 0 || plane == 1);
  Av1ColorMapParam color_map_params;
  get_color_map_params(x, plane, bsize, tx_size, type, &color_map_params);
  // The first color index does not use context or entropy.
  (*t)->token = color_map_params.color_map[0];
  (*t)->color_ctx = -1;
  ++(*t);
  cost_and_tokenize_map(&color_map_params, t, plane, 0, allow_update_cdf,
                        counts);
}